

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O3

void __thiscall
QDataWidgetMapperPrivate::closeEditor(QDataWidgetMapperPrivate *this,QWidget *w,EndEditHint hint)

{
  pointer pWVar1;
  pointer pWVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar6;
  int iVar7;
  long lVar8;
  QWidget *pQVar9;
  pointer pWVar10;
  
  pWVar1 = (this->widgetMap).
           super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pWVar2 = (this->widgetMap).
           super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pWVar1 != pWVar2) {
    lVar8 = 0;
    do {
      lVar3 = *(long *)((long)&(pWVar1->widget).wp.d + lVar8);
      if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
        pQVar9 = (QWidget *)0x0;
      }
      else {
        pQVar9 = *(QWidget **)((long)&(pWVar1->widget).wp.value + lVar8);
      }
      if (pQVar9 == w) {
        iVar7 = (int)(lVar8 >> 3) * -0x49249249;
        if (iVar7 == -1) {
          return;
        }
        if (hint == EditNextItem) {
          UNRECOVERED_JUMPTABLE = *(code **)(*(long *)w + 0x198);
          uVar6 = 1;
        }
        else {
          if (hint != EditPreviousItem) {
            if (hint != RevertModelCache) {
              return;
            }
            uVar4 = (ulong)iVar7;
            uVar5 = ((long)pWVar2 - (long)pWVar1 >> 3) * 0x6db6db6db6db6db7;
            if (uVar4 <= uVar5 && uVar5 - uVar4 != 0) {
              populate(this,pWVar1 + uVar4);
              return;
            }
            closeEditor();
          }
          UNRECOVERED_JUMPTABLE = *(code **)(*(long *)w + 0x198);
          uVar6 = 0;
        }
        (*UNRECOVERED_JUMPTABLE)(w,uVar6,hint,UNRECOVERED_JUMPTABLE);
        return;
      }
      pWVar10 = (pointer)((long)&pWVar1[1].widget.wp.d + lVar8);
      lVar8 = lVar8 + 0x38;
    } while (pWVar10 != pWVar2);
  }
  return;
}

Assistant:

void QDataWidgetMapperPrivate::closeEditor(QWidget *w, QAbstractItemDelegate::EndEditHint hint)
{
    int idx = findWidget(w);
    if (idx == -1)
        return; // not our widget

    switch (hint) {
    case QAbstractItemDelegate::RevertModelCache: {
        populate(widgetMap[idx]);
        break; }
    case QAbstractItemDelegate::EditNextItem:
        w->focusNextChild();
        break;
    case QAbstractItemDelegate::EditPreviousItem:
        w->focusPreviousChild();
        break;
    case QAbstractItemDelegate::SubmitModelCache:
    case QAbstractItemDelegate::NoHint:
        // nothing
        break;
    }
}